

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttpost.c
# Opt level: O0

FT_Error load_post_names(TT_Face face)

{
  ulong local_30;
  FT_ULong post_len;
  FT_Fixed format;
  FT_Stream pFStack_18;
  FT_Error error;
  FT_Stream stream;
  TT_Face face_local;
  
  pFStack_18 = (face->root).stream;
  stream = (FT_Stream)face;
  format._4_4_ = (*face->goto_table)(face,0x706f7374,pFStack_18,&local_30);
  if (format._4_4_ == 0) {
    post_len = stream[9].pathname.value;
    format._4_4_ = FT_Stream_Skip(pFStack_18,0x20);
    if (format._4_4_ == 0) {
      if ((post_len == 0x20000) && (0x21 < local_30)) {
        format._4_4_ = load_format_20((TT_Face)stream,pFStack_18,local_30 - 0x20);
      }
      else if ((post_len == 0x25000) && (0x21 < local_30)) {
        format._4_4_ = load_format_25((TT_Face)stream,pFStack_18,local_30 - 0x20);
      }
      else {
        format._4_4_ = 3;
      }
      *(undefined1 *)&stream[0xc].memory = 1;
    }
  }
  return format._4_4_;
}

Assistant:

static FT_Error
  load_post_names( TT_Face  face )
  {
    FT_Stream  stream;
    FT_Error   error;
    FT_Fixed   format;
    FT_ULong   post_len;


    /* get a stream for the face's resource */
    stream = face->root.stream;

    /* seek to the beginning of the PS names table */
    error = face->goto_table( face, TTAG_post, stream, &post_len );
    if ( error )
      goto Exit;

    format = face->postscript.FormatType;

    /* go to beginning of subtable */
    if ( FT_STREAM_SKIP( 32 ) )
      goto Exit;

    /* now read postscript table */
    if ( format == 0x00020000L && post_len >= 34 )
      error = load_format_20( face, stream, post_len - 32 );
    else if ( format == 0x00025000L && post_len >= 34 )
      error = load_format_25( face, stream, post_len - 32 );
    else
      error = FT_THROW( Invalid_File_Format );

    face->postscript_names.loaded = 1;

  Exit:
    return error;
  }